

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::Dump(Func *this,IRDumpFlags flags)

{
  Instr **ppIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  Instr *this_00;
  
  DumpHeader(this);
  this_00 = this->m_headInstr;
  if (this_00 != (Instr *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar5 = (Instr *)0x0;
    do {
      if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x885,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      IR::Instr::DumpGlobOptInstrString(this_00);
      (**this_00->_vptr_Instr)(this_00,flags);
      ppIVar1 = &this_00->m_next;
      pIVar5 = this_00;
      this_00 = *ppIVar1;
    } while (*ppIVar1 != (Instr *)0x0);
  }
  Output::Flush();
  return;
}

Assistant:

void
Func::Dump(IRDumpFlags flags)
{
    this->DumpHeader();

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instr->DumpGlobOptInstrString();
        instr->Dump(flags);
    }NEXT_INSTR_IN_FUNC;

    Output::Flush();
}